

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_string
          (CmdlineParser *this,char key,string *longkey,string *dest,string *desc)

{
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  add_string(this,key,longkey,&local_50,dest,desc);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CmdlineParser::add_string(char key, const std::string& longkey,
                               std::string& dest, const std::string& desc) {
    return add_string(key, longkey, "", dest, desc);
}